

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::SetFromHex(ConfidentialTransaction *this,string *hex_string)

{
  allocator<unsigned_char> *paVar1;
  uint32_t index_00;
  uint32_t sequence;
  void *pvVar2;
  long lVar3;
  undefined8 uVar4;
  CfdException *this_00;
  uchar *puVar5;
  undefined8 *puVar6;
  char *pcVar7;
  uchar *puVar8;
  CfdException *exception;
  ByteData local_760;
  ByteData local_748;
  ConfidentialNonce local_730;
  ByteData local_708;
  ConfidentialValue local_6f0;
  ByteData local_6c8;
  ConfidentialAssetId local_6b0;
  ByteData local_688;
  Script local_670;
  undefined1 local_638 [8];
  ConfidentialTxOut txout;
  wally_tx_output *txout_item;
  size_t index_1;
  int local_528;
  char *local_520;
  ByteData local_518;
  ScriptWitness local_500;
  allocator<unsigned_char> local_4d9;
  undefined1 local_4d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf_1;
  wally_tx_witness_item *witness_stack_1;
  size_t w_index_1;
  ScriptWitness local_498;
  allocator<unsigned_char> local_471;
  undefined1 local_470 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf;
  size_t w_index;
  wally_tx_witness_item *witness_stack;
  ByteData local_428;
  ByteData local_410;
  ByteData local_3f8;
  ConfidentialValue local_3e0;
  ByteData local_3b8;
  ConfidentialValue local_3a0;
  ByteData256 local_378;
  ByteData256 local_360;
  ScriptWitness local_348;
  ByteData256 local_328;
  Txid local_310;
  undefined1 local_2f0 [8];
  ConfidentialTxIn txin;
  undefined1 local_188 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy;
  undefined1 local_168 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> blinding_buf;
  undefined1 local_138 [8];
  Script unlocking_script;
  undefined1 local_f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_buf;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_buf;
  wally_tx_input *txin_item;
  size_t index;
  string local_a8;
  CfdSourceLocation local_88;
  int local_60;
  undefined4 local_5c;
  int ret;
  uint32_t flag;
  wally_tx *tx_pointer;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> vout_work;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> vin_work;
  void *original_address;
  string *hex_string_local;
  ConfidentialTransaction *this_local;
  
  pvVar2 = (this->super_AbstractTransaction).wally_tx_pointer_;
  ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::vector
            ((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
             &vout_work.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::vector
            ((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *)
             &tx_pointer);
  _ret = (void *)0x0;
  local_5c = 2;
  uVar4 = ::std::__cxx11::string::c_str();
  local_60 = wally_tx_from_hex(uVar4,local_5c,&ret);
  if (local_60 == 0) {
    (this->super_AbstractTransaction).wally_tx_pointer_ = _ret;
    local_60 = 0;
    for (txin_item = (wally_tx_input *)0x0; txin_item < *(wally_tx_input **)((long)_ret + 0x10);
        txin_item = (wally_tx_input *)(txin_item->txhash + 1)) {
      puVar5 = (uchar *)(*(long *)((long)_ret + 8) + (long)txin_item * 0xd0);
      paVar1 = (allocator<unsigned_char> *)
               ((long)&script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar5;
      ::std::allocator<unsigned_char>::allocator(paVar1);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,puVar5,
                 puVar5 + 0x20,paVar1);
      ::std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&script_buf.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      puVar5 = *(uchar **)
                (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x28);
      lVar3 = *(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x30);
      paVar1 = (allocator<unsigned_char> *)
               ((long)&unlocking_script.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<unsigned_char>::allocator(paVar1);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f8,puVar5,
                 puVar5 + lVar3,paVar1);
      ::std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&unlocking_script.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      ByteData::ByteData((ByteData *)
                         &blinding_buf.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
      Script::Script((Script *)local_138,
                     (ByteData *)
                     &blinding_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ByteData::~ByteData((ByteData *)
                          &blinding_buf.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      puVar8 = txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x41;
      puVar5 = txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x61;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<unsigned_char>::allocator(paVar1);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_168,puVar8,puVar5,
                 paVar1);
      ::std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      puVar8 = txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x61;
      puVar5 = txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x81;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&txin.pegin_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<unsigned_char>::allocator(paVar1);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_188,puVar8,puVar5,
                 paVar1);
      ::std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&txin.pegin_witness_.witness_stack_.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      ByteData256::ByteData256
                (&local_328,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      Txid::Txid(&local_310,&local_328);
      index_00 = *(uint32_t *)
                  (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x20);
      sequence = *(uint32_t *)
                  (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x24);
      ScriptWitness::ScriptWitness(&local_348);
      ByteData256::ByteData256
                (&local_360,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
      ByteData256::ByteData256
                (&local_378,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
      ConvertToByteData(&local_3b8,
                        *(uint8_t **)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x88),
                        *(size_t *)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x90));
      ConfidentialValue::ConfidentialValue(&local_3a0,&local_3b8);
      ConvertToByteData(&local_3f8,
                        *(uint8_t **)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x98),
                        *(size_t *)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xa0));
      ConfidentialValue::ConfidentialValue(&local_3e0,&local_3f8);
      ConvertToByteData(&local_410,
                        *(uint8_t **)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xa8),
                        *(size_t *)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xb0));
      ConvertToByteData(&local_428,
                        *(uint8_t **)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xb8),
                        *(size_t *)
                         (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xc0));
      ScriptWitness::ScriptWitness((ScriptWitness *)&witness_stack);
      ConfidentialTxIn::ConfidentialTxIn
                ((ConfidentialTxIn *)local_2f0,&local_310,index_00,sequence,(Script *)local_138,
                 &local_348,&local_360,&local_378,&local_3a0,&local_3e0,&local_410,&local_428,
                 (ScriptWitness *)&witness_stack);
      ScriptWitness::~ScriptWitness((ScriptWitness *)&witness_stack);
      ByteData::~ByteData(&local_428);
      ByteData::~ByteData(&local_410);
      ConfidentialValue::~ConfidentialValue(&local_3e0);
      ByteData::~ByteData(&local_3f8);
      ConfidentialValue::~ConfidentialValue(&local_3a0);
      ByteData::~ByteData(&local_3b8);
      ByteData256::~ByteData256(&local_378);
      ByteData256::~ByteData256(&local_360);
      ScriptWitness::~ScriptWitness(&local_348);
      Txid::~Txid(&local_310);
      ByteData256::~ByteData256(&local_328);
      if ((*(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) != 0) &&
         (*(long *)(*(long *)(txid_buf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) + 8) != 0))
      {
        for (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage <
            *(pointer *)
             (*(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) + 8);
            witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          puVar6 = (undefined8 *)
                   (**(long **)(txid_buf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) +
                   (long)witness_buf.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage * 0x10);
          puVar5 = (uchar *)*puVar6;
          lVar3 = puVar6[1];
          ::std::allocator<unsigned_char>::allocator(&local_471);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_470,puVar5,
                     puVar5 + lVar3,&local_471);
          ::std::allocator<unsigned_char>::~allocator(&local_471);
          ByteData::ByteData((ByteData *)&w_index_1,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
          AbstractTxIn::AddScriptWitnessStack
                    (&local_498,(AbstractTxIn *)local_2f0,(ByteData *)&w_index_1);
          ScriptWitness::~ScriptWitness(&local_498);
          ByteData::~ByteData((ByteData *)&w_index_1);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
        }
      }
      if ((*(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 200) != 0) &&
         (*(long *)(*(long *)(txid_buf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 200) + 8) != 0)) {
        for (witness_stack_1 = (wally_tx_witness_item *)0x0;
            witness_stack_1 <
            *(wally_tx_witness_item **)
             (*(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 200) + 8);
            witness_stack_1 = (wally_tx_witness_item *)((long)&witness_stack_1->witness + 1)) {
          witness_buf_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(**(long **)(txid_buf.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 200) +
                        (long)witness_stack_1 * 0x10);
          puVar5 = *(uchar **)
                    witness_buf_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar3 = *(long *)(witness_buf_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 8);
          ::std::allocator<unsigned_char>::allocator(&local_4d9);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4d8,puVar5,
                     puVar5 + lVar3,&local_4d9);
          ::std::allocator<unsigned_char>::~allocator(&local_4d9);
          ByteData::ByteData(&local_518,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4d8);
          ConfidentialTxIn::AddPeginWitnessStack
                    (&local_500,(ConfidentialTxIn *)local_2f0,&local_518);
          ScriptWitness::~ScriptWitness(&local_500);
          ByteData::~ByteData(&local_518);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4d8);
        }
      }
      ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
      push_back((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *
                )&vout_work.
                  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_2f0);
      ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_2f0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
      Script::~Script((Script *)local_138);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    }
    pcVar7 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
    index_1 = (size_t)(pcVar7 + 1);
    local_528 = 0x55b;
    local_520 = "SetFromHex";
    logger::info<unsigned_long&>
              ((CfdSourceLocation *)&index_1,"num_outputs={} ",(unsigned_long *)((long)_ret + 0x28))
    ;
    for (txout_item = (wally_tx_output *)0x0; txout_item < *(wally_tx_output **)((long)_ret + 0x28);
        txout_item = (wally_tx_output *)((long)&txout_item->satoshi + 1)) {
      txout.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(*(long *)((long)_ret + 0x20) + (long)txout_item * 0x70);
      ConvertToByteData(&local_688,
                        *(uint8_t **)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 8),
                        *(size_t *)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x10));
      Script::Script(&local_670,&local_688);
      ConvertToByteData(&local_6c8,
                        *(uint8_t **)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x20),
                        *(size_t *)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x28));
      ConfidentialAssetId::ConfidentialAssetId(&local_6b0,&local_6c8);
      ConvertToByteData(&local_708,
                        *(uint8_t **)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x30),
                        *(size_t *)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x38));
      ConfidentialValue::ConfidentialValue(&local_6f0,&local_708);
      ConvertToByteData(&local_748,
                        *(uint8_t **)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x40),
                        *(size_t *)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x48));
      ConfidentialNonce::ConfidentialNonce(&local_730,&local_748);
      ConvertToByteData(&local_760,
                        *(uint8_t **)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x50),
                        *(size_t *)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x58));
      ConvertToByteData((ByteData *)&exception,
                        *(uint8_t **)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x60),
                        *(size_t *)
                         (txout.range_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x68));
      ConfidentialTxOut::ConfidentialTxOut
                ((ConfidentialTxOut *)local_638,&local_670,&local_6b0,&local_6f0,&local_730,
                 &local_760,(ByteData *)&exception);
      ByteData::~ByteData((ByteData *)&exception);
      ByteData::~ByteData(&local_760);
      ConfidentialNonce::~ConfidentialNonce(&local_730);
      ByteData::~ByteData(&local_748);
      ConfidentialValue::~ConfidentialValue(&local_6f0);
      ByteData::~ByteData(&local_708);
      ConfidentialAssetId::~ConfidentialAssetId(&local_6b0);
      ByteData::~ByteData(&local_6c8);
      Script::~Script(&local_670);
      ByteData::~ByteData(&local_688);
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      push_back((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                 *)&tx_pointer,(value_type *)local_638);
      ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_638);
    }
    if (pvVar2 != (void *)0x0) {
      wally_tx_free(pvVar2);
      ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
      clear(&this->vin_);
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      clear(&this->vout_);
    }
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    operator=(&this->vin_,
              (vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
              &vout_work.
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    operator=(&this->vout_,
              (vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *
              )&tx_pointer);
    ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    ~vector((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *)
            &tx_pointer);
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    ~vector((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
            &vout_work.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  local_88.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_88.filename = local_88.filename + 1;
  local_88.line = 0x516;
  local_88.funcname = "SetFromHex";
  logger::warn<int&>(&local_88,"wally_tx_from_hex NG[{}] ",&local_60);
  index._6_1_ = 1;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_a8,"transaction data invalid.",(allocator *)((long)&index + 7));
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_a8);
  index._6_1_ = 0;
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetFromHex(const std::string &hex_string) {
  void *original_address = wally_tx_pointer_;
  std::vector<ConfidentialTxIn> vin_work;
  std::vector<ConfidentialTxOut> vout_work;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  struct wally_tx *tx_pointer = NULL;
  uint32_t flag = WALLY_TX_FLAG_USE_ELEMENTS;
  int ret = wally_tx_from_hex(hex_string.c_str(), flag, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }
  wally_tx_pointer_ = tx_pointer;

  try {
    // create ConfidentialTxIn and ConfidentialTxOut
    for (size_t index = 0; index < tx_pointer->num_inputs; ++index) {
      struct wally_tx_input *txin_item = &tx_pointer->inputs[index];
      std::vector<uint8_t> txid_buf(
          txin_item->txhash, txin_item->txhash + sizeof(txin_item->txhash));
      std::vector<uint8_t> script_buf(
          txin_item->script, txin_item->script + txin_item->script_len);
      Script unlocking_script = Script(ByteData(script_buf));
      /* Temporarily comment out
      if (!unlocking_script.IsPushOnly()) {
        warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unlocking script error. "
            "The script needs to be push operator only.");
      } */
      std::vector<uint8_t> blinding_buf(
          txin_item->blinding_nonce,
          txin_item->blinding_nonce + sizeof(txin_item->blinding_nonce));
      std::vector<uint8_t> entropy(
          txin_item->entropy, txin_item->entropy + sizeof(txin_item->entropy));
      ConfidentialTxIn txin(
          Txid(ByteData256(txid_buf)), txin_item->index, txin_item->sequence,
          unlocking_script, ScriptWitness(), ByteData256(blinding_buf),
          ByteData256(entropy),
          ConfidentialValue(ConvertToByteData(
              txin_item->issuance_amount, txin_item->issuance_amount_len)),
          ConfidentialValue(ConvertToByteData(
              txin_item->inflation_keys, txin_item->inflation_keys_len)),
          ConvertToByteData(
              txin_item->issuance_amount_rangeproof,
              txin_item->issuance_amount_rangeproof_len),
          ConvertToByteData(
              txin_item->inflation_keys_rangeproof,
              txin_item->inflation_keys_rangeproof_len),
          ScriptWitness());
      if ((txin_item->witness != NULL) &&
          (txin_item->witness->num_items != 0)) {
        struct wally_tx_witness_item *witness_stack;
        for (size_t w_index = 0; w_index < txin_item->witness->num_items;
             ++w_index) {
          witness_stack = &txin_item->witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddScriptWitnessStack(ByteData(witness_buf));
        }
      }
      if ((txin_item->pegin_witness != NULL) &&
          (txin_item->pegin_witness->num_items != 0)) {
        for (size_t w_index = 0; w_index < txin_item->pegin_witness->num_items;
             ++w_index) {
          struct wally_tx_witness_item *witness_stack;
          witness_stack = &txin_item->pegin_witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddPeginWitnessStack(ByteData(witness_buf));
        }
      }
      vin_work.push_back(txin);
    }

    info(CFD_LOG_SOURCE, "num_outputs={} ", tx_pointer->num_outputs);
    for (size_t index = 0; index < tx_pointer->num_outputs; ++index) {
      struct wally_tx_output *txout_item = &tx_pointer->outputs[index];
      ConfidentialTxOut txout(
          Script(
              ConvertToByteData(txout_item->script, txout_item->script_len)),
          ConfidentialAssetId(
              ConvertToByteData(txout_item->asset, txout_item->asset_len)),
          ConfidentialValue(
              ConvertToByteData(txout_item->value, txout_item->value_len)),
          ConfidentialNonce(
              ConvertToByteData(txout_item->nonce, txout_item->nonce_len)),
          ConvertToByteData(
              txout_item->surjectionproof, txout_item->surjectionproof_len),
          ConvertToByteData(
              txout_item->rangeproof, txout_item->rangeproof_len));
      vout_work.push_back(txout);
    }

    // If the copy process is successful, release the old buffer
    if (original_address != NULL) {
      wally_tx_free(static_cast<struct wally_tx *>(original_address));
      vin_.clear();
      vout_.clear();
    }
    vin_ = vin_work;
    vout_ = vout_work;
  } catch (const CfdException &exception) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw exception;
  } catch (...) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw CfdException(kCfdUnknownError);
  }
}